

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void GCTM(lua_State *L)

{
  lu_byte lVar1;
  lu_byte lVar2;
  global_State *g_00;
  StkId pSVar3;
  TStatus TVar4;
  TValue *io2_1;
  TValue *io1_1;
  TValue *io2;
  TValue *io1;
  lu_byte oldgcstp;
  lu_byte oldah;
  TStatus status;
  GCObject *i_g;
  TValue *io;
  TValue v;
  TValue *tm;
  global_State *g;
  lua_State *L_local;
  
  g_00 = L->l_G;
  io = (TValue *)udata2finalize(g_00);
  v.value_.ub = ((GCObject *)io)->tt | 0x40;
  v._8_8_ = luaT_gettmbyobj(L,(TValue *)&io,TM_GC);
  if ((((TValue *)v._8_8_)->tt_ & 0xf) != 0) {
    lVar1 = L->allowhook;
    lVar2 = g_00->gcstp;
    g_00->gcstp = g_00->gcstp | 2;
    L->allowhook = '\0';
    pSVar3 = (L->top).p;
    (L->top).p = pSVar3 + 1;
    (pSVar3->val).value_ = ((TValue *)v._8_8_)->value_;
    (pSVar3->val).tt_ = ((TValue *)v._8_8_)->tt_;
    pSVar3 = (L->top).p;
    (L->top).p = pSVar3 + 1;
    (pSVar3->val).value_.gc = (GCObject *)io;
    (pSVar3->val).tt_ = v.value_.ub;
    L->ci->callstatus = L->ci->callstatus | 0x1000000;
    TVar4 = luaD_pcall(L,dothecall,(void *)0x0,((L->top).offset + -0x20) - (L->stack).offset,0);
    L->ci->callstatus = L->ci->callstatus & 0xfeffffff;
    L->allowhook = lVar1;
    g_00->gcstp = lVar2;
    if (TVar4 != '\0') {
      luaE_warnerror(L,"__gc");
      (L->top).p = (StkId)((L->top).offset + -0x10);
    }
  }
  return;
}

Assistant:

static void GCTM (lua_State *L) {
  global_State *g = G(L);
  const TValue *tm;
  TValue v;
  lua_assert(!g->gcemergency);
  setgcovalue(L, &v, udata2finalize(g));
  tm = luaT_gettmbyobj(L, &v, TM_GC);
  if (!notm(tm)) {  /* is there a finalizer? */
    TStatus status;
    lu_byte oldah = L->allowhook;
    lu_byte oldgcstp  = g->gcstp;
    g->gcstp |= GCSTPGC;  /* avoid GC steps */
    L->allowhook = 0;  /* stop debug hooks during GC metamethod */
    setobj2s(L, L->top.p++, tm);  /* push finalizer... */
    setobj2s(L, L->top.p++, &v);  /* ... and its argument */
    L->ci->callstatus |= CIST_FIN;  /* will run a finalizer */
    status = luaD_pcall(L, dothecall, NULL, savestack(L, L->top.p - 2), 0);
    L->ci->callstatus &= ~CIST_FIN;  /* not running a finalizer anymore */
    L->allowhook = oldah;  /* restore hooks */
    g->gcstp = oldgcstp;  /* restore state */
    if (l_unlikely(status != LUA_OK)) {  /* error while running __gc? */
      luaE_warnerror(L, "__gc");
      L->top.p--;  /* pops error object */
    }
  }
}